

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O1

void mean_double_suite::run(void)

{
  test_ctor();
  test_same();
  test_alternating();
  test_linear_increase();
  test_linear_decrease();
  test_exponential_increase();
  test_clear();
  return;
}

Assistant:

void run()
{
    test_ctor();
    test_same();
    test_alternating();
    test_linear_increase();
    test_linear_decrease();
    test_exponential_increase();
    test_clear();
}